

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O2

void __thiscall
Handler::DeployVirtualMachine
          (Handler *this,uint16_t *purchasedServerIdx,Request *req,LOCATION *location)

{
  PurchasedServer *purchasedServer;
  undefined2 uVar1;
  undefined2 uVar3;
  undefined2 uVar4;
  ulong uVar2;
  undefined2 uVar5;
  uint16_t uVar6;
  ushort uVar7;
  LOCATION LVar8;
  pointer pPVar9;
  pointer pVVar10;
  uint8_t uVar11;
  mapped_type mVar12;
  DeployedVirtualMachine *__args;
  uint16_t *puVar13;
  mapped_type *pmVar14;
  undefined1 auVar15 [16];
  int vmId;
  uint32_t n;
  ulong local_48;
  ulong local_40;
  LOCATION *local_38;
  
  pPVar9 = (this->purchasedServers).
           super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>._M_impl.
           super__Vector_impl_data._M_start;
  purchasedServer = pPVar9 + *purchasedServerIdx;
  uVar6 = pPVar9[*purchasedServerIdx].id;
  uVar7 = req->vmIdx;
  vmId = req->vmId;
  local_40 = (ulong)req->addIdx;
  pVVar10 = (this->virtualMachines).
            super__Vector_base<VirtualMachine,_std::allocator<VirtualMachine>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_38 = location;
  __args = (DeployedVirtualMachine *)operator_new(0xc);
  __args->purchasedServerId = 0;
  __args->vmIdx = 0;
  __args->vmId = 0;
  *(undefined4 *)&__args->location = 0;
  puVar13 = (uint16_t *)operator_new(8);
  puVar13[0] = 0;
  puVar13[1] = 0;
  puVar13[2] = 0;
  puVar13[3] = 0;
  mVar12 = (mapped_type)
           (((long)(this->deployedVMs).
                   super__Vector_base<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->deployedVMs).
                  super__Vector_base<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0xc);
  pVVar10 = pVVar10 + uVar7;
  uVar2._0_2_ = pVVar10->cpuCore;
  uVar2._2_2_ = pVVar10->memorySize;
  uVar2._4_1_ = pVVar10->nodeType;
  uVar2._5_3_ = *(undefined3 *)&pVVar10->field_0x25;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar2;
  LVar8 = *local_38;
  if (LVar8 == ALL) {
    auVar15 = pshuflw(auVar15,auVar15,0x50);
    uVar1 = purchasedServer->remainCpuCoreA;
    uVar3 = purchasedServer->remainCpuCoreB;
    uVar4 = purchasedServer->remainMemorySizeA;
    uVar5 = purchasedServer->remainMemorySizeB;
    purchasedServer->remainCpuCoreA = uVar1 - (auVar15._0_2_ >> 1);
    purchasedServer->remainCpuCoreB = uVar3 - (auVar15._2_2_ >> 1);
    purchasedServer->remainMemorySizeA = uVar4 - (auVar15._4_2_ >> 1);
    purchasedServer->remainMemorySizeB = uVar5 - (auVar15._6_2_ >> 1);
  }
  else if (LVar8 == NODE_B) {
    purchasedServer->remainCpuCoreB = purchasedServer->remainCpuCoreB - (undefined2)uVar2;
    purchasedServer->remainMemorySizeB = purchasedServer->remainMemorySizeB - uVar2._2_2_;
    __args->location = false;
  }
  else {
    if (LVar8 != NODE_A) {
      return;
    }
    purchasedServer->remainCpuCoreA = purchasedServer->remainCpuCoreA - (undefined2)uVar2;
    purchasedServer->remainMemorySizeA = purchasedServer->remainMemorySizeA - uVar2._2_2_;
    __args->location = true;
  }
  *(LOCATION *)(puVar13 + 2) = LVar8;
  this->deployedVMNum = this->deployedVMNum + 1;
  n = mVar12;
  local_48 = (ulong)uVar7;
  pmVar14 = std::__detail::
            _Map_base<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->idDeployedVMMap,&vmId);
  *pmVar14 = mVar12;
  std::
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_M_emplace<unsigned_int&>
            ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&purchasedServer->deployedVM,&n);
  uVar11 = CalculateVacancyRate(this,purchasedServer);
  purchasedServer->vacancyRate = uVar11;
  __args->purchasedServerId = uVar6;
  __args->vmIdx = (uint16_t)local_48;
  __args->vmId = vmId;
  std::vector<DeployedVirtualMachine,std::allocator<DeployedVirtualMachine>>::
  emplace_back<DeployedVirtualMachine&>
            ((vector<DeployedVirtualMachine,std::allocator<DeployedVirtualMachine>> *)
             &this->deployedVMs,__args);
  *puVar13 = uVar6;
  *(undefined8 *)
   (*(long *)&(this->result).super__Vector_base<Result,_std::allocator<Result>_>._M_impl.
              super__Vector_impl_data._M_start[this->today].requestResult.
              super__Vector_base<RequestResult,_std::allocator<RequestResult>_>._M_impl.
              super__Vector_impl_data + local_40 * 8) = *(undefined8 *)puVar13;
  return;
}

Assistant:

void Handler::DeployVirtualMachine(const uint16_t &purchasedServerIdx, const Request &req, const LOCATION &location) {
    PurchasedServer &purchasedServer = purchasedServers[purchasedServerIdx];
    uint16_t purchasedServerId = purchasedServer.id;
    uint16_t vmIdx = req.vmIdx;
    int vmId = req.vmId;
    uint32_t addIdx = req.addIdx;
    VirtualMachine &vm = virtualMachines[vmIdx];

    auto *deployedVM = new DeployedVirtualMachine();
    auto *requestResult = new RequestResult();
    uint32_t n = deployedVMs.size();
    uint16_t cpuCore = vm.cpuCore;
    uint16_t memorySize = vm.memorySize;

    switch (location) {
        case NODE_A:
            purchasedServer.remainCpuCoreA -= cpuCore;
            purchasedServer.remainMemorySizeA -= memorySize;
            deployedVM->location = true;
            requestResult->location = NODE_A;
            break;
        case NODE_B:
            purchasedServer.remainCpuCoreB -= cpuCore;
            purchasedServer.remainMemorySizeB -= memorySize;
            deployedVM->location = false;
            requestResult->location = NODE_B;
            break;
        case ALL:
            purchasedServer.remainCpuCoreA -= cpuCore >> 1u;
            purchasedServer.remainCpuCoreB -= cpuCore >> 1u;
            purchasedServer.remainMemorySizeA -= memorySize >> 1u;
            purchasedServer.remainMemorySizeB -= memorySize >> 1u;
            requestResult->location = ALL;
            break;
        default:
            return;
    }

    ++deployedVMNum;
    idDeployedVMMap[vmId] = n;
    purchasedServer.deployedVM.emplace(n);
    purchasedServer.vacancyRate = CalculateVacancyRate(purchasedServer);
    deployedVM->purchasedServerId = purchasedServerId;
    deployedVM->vmIdx = vmIdx;
    deployedVM->vmId = vmId;
    deployedVMs.emplace_back(*deployedVM);
    requestResult->purchasedServerId = purchasedServerId;
    result[today].requestResult[addIdx] = *requestResult;
}